

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyExporter.cpp
# Opt level: O2

void Assimp::ExportScenePly
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *param_4)

{
  int iVar1;
  undefined4 extraout_var;
  undefined8 uVar3;
  DeadlyImportError *pDVar4;
  allocator<char> local_219;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  PlyExporter exporter;
  long *plVar2;
  
  PlyExporter::PlyExporter(&exporter,pFile,pScene,false);
  if (((&exporter.field_0x20)[*(long *)(exporter._0_8_ + -0x18)] & 5) != 0) {
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,pFile,&local_219);
    std::operator+(&local_218,"output data creation failed. Most likely the file became too large: "
                   ,&local_1f8);
    DeadlyImportError::DeadlyImportError(pDVar4,&local_218);
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wt");
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 != (long *)0x0) {
    std::__cxx11::stringbuf::str();
    uVar3 = std::ostream::tellp();
    (**(code **)(*plVar2 + 0x18))(plVar2,local_218._M_dataplus._M_p,uVar3,1);
    std::__cxx11::string::~string((string *)&local_218);
    (**(code **)(*plVar2 + 8))(plVar2);
    PlyExporter::~PlyExporter(&exporter);
    return;
  }
  pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,pFile,&local_219);
  std::operator+(&local_218,"could not open output .ply file: ",&local_1f8);
  DeadlyImportError::DeadlyImportError(pDVar4,&local_218);
  __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ExportScenePly(const char* pFile,IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* /*pProperties*/)
{
    // invoke the exporter
    PlyExporter exporter(pFile, pScene);

    if (exporter.mOutput.fail()) {
        throw DeadlyExportError("output data creation failed. Most likely the file became too large: " + std::string(pFile));
    }

    // we're still here - export successfully completed. Write the file.
    std::unique_ptr<IOStream> outfile (pIOSystem->Open(pFile,"wt"));
    if(outfile == NULL) {
        throw DeadlyExportError("could not open output .ply file: " + std::string(pFile));
    }

    outfile->Write( exporter.mOutput.str().c_str(), static_cast<size_t>(exporter.mOutput.tellp()),1);
}